

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
left_most_traversal(iterator *this,node_ptr node)

{
  bool bVar1;
  node_type type;
  undefined1 local_48 [8];
  iter_result e;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  node_type node_type;
  iterator *this_local;
  node_ptr node_local;
  
  this_local = (iterator *)node.tagged_ptr;
  while( true ) {
    bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==
                      ((basic_node_ptr<unodb::detail::node_header> *)&this_local,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("node != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                    ,0x473,
                    "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::left_most_traversal(detail::node_ptr) [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    type = detail::basic_node_ptr<unodb::detail::node_header>::type
                     ((basic_node_ptr<unodb::detail::node_header> *)&this_local);
    if (type == LEAF) break;
    e.prefix = (key_prefix_snapshot)
               detail::basic_node_ptr<unodb::detail::node_header>::
               ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                         ((basic_node_ptr<unodb::detail::node_header> *)&this_local);
    detail::
    basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
    ::begin((iter_result *)local_48,
            (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             *)e.prefix,type);
    push(this,(iter_result *)local_48);
    this_local = (iterator *)
                 detail::
                 basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                              *)e.prefix,type,e.node.tagged_ptr._1_1_);
  }
  push_leaf(this,(node_ptr)this_local);
  return this;
}

Assistant:

typename db<Key, Value>::iterator&
db<Key, Value>::iterator::left_most_traversal(detail::node_ptr node) {
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      push_leaf(node);
      return *this;  // done
    }
    // recursive descent.
    auto* const inode{node.ptr<inode_type*>()};
    const auto e =
        inode->begin(node_type);  // first child of current internal node
    push(e);                      // push the entry on the stack.
    node = inode->get_child(node_type, e.child_index);  // get the child
  }
  UNODB_DETAIL_CANNOT_HAPPEN();
}